

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.h
# Opt level: O2

uint * __thiscall ON_MeshFaceList::QuadFvi(ON_MeshFaceList *this,uint face_index,uint *buffer)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  
  if (face_index < this->m_face_count) {
    puVar1 = this->m_faces;
    uVar3 = (ulong)(face_index * this->m_face_stride);
    *buffer = puVar1[uVar3];
    buffer[1] = puVar1[uVar3 + 1];
    uVar2 = puVar1[uVar3 + 2];
    buffer[2] = uVar2;
    if (this->m_bQuadFaces == true) {
      uVar2 = puVar1[uVar3 + 3];
    }
    buffer[3] = uVar2;
    return buffer;
  }
  buffer[0] = 0;
  buffer[1] = 0;
  buffer[2] = 0;
  buffer[3] = 0;
  return buffer;
}

Assistant:

inline unsigned int* QuadFvi(unsigned int face_index, unsigned int buffer[4]) const
  {
    if ( face_index < m_face_count )
    {
      const unsigned int* p = m_faces + (face_index*m_face_stride);
      buffer[0] = *p;
      buffer[1] = *(++p);
      buffer[2] = *(++p);
      buffer[3] = m_bQuadFaces ? *(++p) : buffer[2];
    }
    else
    {
      buffer[0] = buffer[1] = buffer[2] = buffer[3] = 0;
    }
    return buffer;
  }